

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O1

optional<pbrt::SampledGrid<float>_> * __thiscall
pstd::optional<pbrt::SampledGrid<float>_>::operator=
          (optional<pbrt::SampledGrid<float>_> *this,SampledGrid<float> *v)

{
  size_t sVar1;
  
  if (this->set == true) {
    vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector
              ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)this);
    this->set = false;
  }
  (this->optionalValue).__align =
       (anon_struct_8_0_00000001_for___align)(v->values).alloc.memoryResource;
  *(undefined8 *)((long)&this->optionalValue + 8) = 0;
  *(undefined8 *)((long)&this->optionalValue + 0x10) = 0;
  *(undefined8 *)((long)&this->optionalValue + 0x18) = 0;
  sVar1 = (v->values).nStored;
  *(size_t *)((long)&this->optionalValue + 0x10) = (v->values).nAlloc;
  *(size_t *)((long)&this->optionalValue + 0x18) = sVar1;
  *(float **)((long)&this->optionalValue + 8) = (v->values).ptr;
  (v->values).nStored = 0;
  (v->values).ptr = (float *)0x0;
  (v->values).nAlloc = 0;
  *(int *)((long)&this->optionalValue + 0x28) = v->nz;
  *(undefined8 *)((long)&this->optionalValue + 0x20) = *(undefined8 *)&v->nx;
  this->set = true;
  return this;
}

Assistant:

PBRT_CPU_GPU
    optional &operator=(T &&v) {
        reset();
        new (ptr()) T(std::move(v));
        set = true;
        return *this;
    }